

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_store_Fptr(FITSfile *Fptr,int *status)

{
  int local_24;
  int ii;
  int *status_local;
  FITSfile *Fptr_local;
  
  if (*status < 1) {
    for (local_24 = 0; local_24 < 10000; local_24 = local_24 + 1) {
      if (FptrTable[local_24] == (FITSfile *)0x0) {
        FptrTable[local_24] = Fptr;
        break;
      }
    }
    Fptr_local._4_4_ = *status;
  }
  else {
    Fptr_local._4_4_ = *status;
  }
  return Fptr_local._4_4_;
}

Assistant:

int fits_store_Fptr(FITSfile *Fptr,  /* O - FITS file pointer               */ 
           int *status)              /* IO - error status                   */
/*
   store the new Fptr address for future use by fits_already_open 
*/
{
    int ii;

    if (*status > 0)
        return(*status);

    FFLOCK;
    for (ii = 0; ii < NMAXFILES; ii++) {
        if (FptrTable[ii] == 0) {
            FptrTable[ii] = Fptr;
            break;
        }
    }
    FFUNLOCK;
    return(*status);
}